

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.cpp
# Opt level: O0

product * get_product(product *__return_storage_ptr__,int id)

{
  JsonRpcException *this;
  allocator<char> local_49;
  string local_48;
  undefined1 local_25;
  undefined1 local_15;
  int local_14;
  product *ppStack_10;
  int id_local;
  product *p;
  
  local_14 = id;
  ppStack_10 = __return_storage_ptr__;
  if (id == 1) {
    local_15 = 0;
    product::product(__return_storage_ptr__);
    __return_storage_ptr__->id = 1;
    __return_storage_ptr__->price = 22.5;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,"some product");
    __return_storage_ptr__->cat = ord;
  }
  else {
    if (id != 2) {
      this = (JsonRpcException *)__cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"product not found",&local_49);
      jsonrpccxx::JsonRpcException::JsonRpcException(this,-50000,&local_48);
      __cxa_throw(this,&jsonrpccxx::JsonRpcException::typeinfo,
                  jsonrpccxx::JsonRpcException::~JsonRpcException);
    }
    local_25 = 0;
    product::product(__return_storage_ptr__);
    __return_storage_ptr__->id = 2;
    __return_storage_ptr__->price = 55.5;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,"some product 2");
    __return_storage_ptr__->cat = cash_carry;
  }
  return __return_storage_ptr__;
}

Assistant:

product get_product(int id) {
  if (id == 1) {
    product p;
    p.id = 1;
    p.price = 22.50;
    p.name = "some product";
    p.cat = category::order;
    return p;
  }
  else if (id == 2) {
    product p;
    p.id = 2;
    p.price = 55.50;
    p.name = "some product 2";
    p.cat = category::cash_carry;
    return p;
  }
  throw JsonRpcException(-50000, "product not found");
}